

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  ulong uVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  CppType CVar5;
  Type TVar6;
  LogMessage *pLVar7;
  ulong uVar8;
  EnumDescriptor *this_00;
  string *psVar9;
  AlphaNum *a;
  Message *local_2b8;
  int local_284;
  string *local_260;
  bool local_249;
  double local_240;
  float local_22c;
  uint64_t local_220;
  uint32_t local_20c;
  int64_t local_200;
  int32_t local_1ec;
  AlphaNum local_1b8;
  string local_188;
  EnumValueDescriptor *local_168;
  EnumValueDescriptor *enum_desc;
  int enum_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [8];
  string truncated_value;
  string *value_to_print;
  string *value;
  string scratch;
  FastFieldValuePrinter *printer;
  byte local_71;
  LogMessage local_70;
  TextGenerator *local_38;
  TextGenerator *generator_local;
  FieldDescriptor *pFStack_28;
  int index_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  local_38 = generator;
  generator_local._4_4_ = index;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  bVar4 = FieldDescriptor::is_repeated(field);
  local_71 = 0;
  if ((!bVar4) && (generator_local._4_4_ != -1)) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x9cd);
    local_71 = 1;
    pLVar7 = internal::LogMessage::operator<<
                       (&local_70,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)((long)&printer + 3),pLVar7);
  }
  if ((local_71 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_70);
  }
  scratch.field_2._8_8_ = GetFieldPrinter(this,pFStack_28);
  CVar5 = FieldDescriptor::cpp_type(pFStack_28);
  uVar3 = scratch.field_2._8_8_;
  switch(CVar5) {
  case CPPTYPE_INT32:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_1ec = Reflection::GetRepeatedInt32
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_1ec = Reflection::GetInt32
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x18))(uVar3,local_1ec,local_38);
    break;
  case CPPTYPE_INT64:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_200 = Reflection::GetRepeatedInt64
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_200 = Reflection::GetInt64
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x28))(uVar3,local_200,local_38);
    break;
  case CPPTYPE_UINT32:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_20c = Reflection::GetRepeatedUInt32
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_20c = Reflection::GetUInt32
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x20))(uVar3,local_20c,local_38);
    break;
  case CPPTYPE_UINT64:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_220 = Reflection::GetRepeatedUInt64
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_220 = Reflection::GetUInt64
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x30))(uVar3,local_220,local_38);
    break;
  case CPPTYPE_DOUBLE:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_240 = Reflection::GetRepeatedDouble
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_240 = Reflection::GetDouble
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x40))(local_240,uVar3,local_38);
    break;
  case CPPTYPE_FLOAT:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_22c = Reflection::GetRepeatedFloat
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_22c = Reflection::GetFloat
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x38))(local_22c,uVar3,local_38);
    break;
  case CPPTYPE_BOOL:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_249 = Reflection::GetRepeatedBool
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_249 = Reflection::GetBool((Reflection *)field_local,(Message *)reflection_local,
                                      pFStack_28);
    }
    (**(code **)(*(long *)uVar3 + 0x10))(uVar3,local_249,local_38);
    break;
  case CPPTYPE_ENUM:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_284 = Reflection::GetRepeatedEnumValue
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_284 = Reflection::GetEnumValue
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
    }
    enum_desc._0_4_ = local_284;
    this_00 = FieldDescriptor::enum_type(pFStack_28);
    local_168 = EnumDescriptor::FindValueByNumber(this_00,(int)enum_desc);
    uVar3 = scratch.field_2._8_8_;
    iVar2 = (int)enum_desc;
    if (local_168 == (EnumValueDescriptor *)0x0) {
      strings::AlphaNum::AlphaNum(&local_1b8,(int)enum_desc);
      StrCat_abi_cxx11_(&local_188,(protobuf *)&local_1b8,a);
      (**(code **)(*(long *)uVar3 + 0x58))(uVar3,iVar2,&local_188,local_38);
      std::__cxx11::string::~string((string *)&local_188);
    }
    else {
      psVar9 = EnumValueDescriptor::name_abi_cxx11_(local_168);
      (**(code **)(*(long *)uVar3 + 0x58))(uVar3,iVar2,psVar9,local_38);
    }
    break;
  case CPPTYPE_STRING:
    std::__cxx11::string::string((string *)&value);
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_260 = Reflection::GetRepeatedStringReference
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_,(string *)&value);
    }
    else {
      local_260 = Reflection::GetStringReference
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             (string *)&value);
    }
    truncated_value.field_2._8_8_ = local_260;
    std::__cxx11::string::string(local_e0);
    if ((0 < this->truncate_string_field_longer_than_) &&
       (uVar1 = this->truncate_string_field_longer_than_, uVar8 = std::__cxx11::string::size(),
       uVar1 < uVar8)) {
      std::__cxx11::string::substr((ulong)&local_120,(ulong)local_260);
      std::operator+(&local_100,&local_120,"...<truncated>...");
      std::__cxx11::string::operator=(local_e0,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      truncated_value.field_2._8_8_ = local_e0;
    }
    TVar6 = FieldDescriptor::type(pFStack_28);
    if (TVar6 == TYPE_STRING) {
      (**(code **)(*(long *)scratch.field_2._8_8_ + 0x48))
                (scratch.field_2._8_8_,truncated_value.field_2._8_8_,local_38);
    }
    else {
      enum_desc._7_1_ = 0;
      TVar6 = FieldDescriptor::type(pFStack_28);
      if (TVar6 != TYPE_BYTES) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&enum_value,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x9f8);
        enum_desc._7_1_ = 1;
        pLVar7 = internal::LogMessage::operator<<
                           ((LogMessage *)&enum_value,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&enum_desc + 6),pLVar7);
      }
      if ((enum_desc._7_1_ & 1) != 0) {
        internal::LogMessage::~LogMessage((LogMessage *)&enum_value);
      }
      (**(code **)(*(long *)scratch.field_2._8_8_ + 0x50))
                (scratch.field_2._8_8_,truncated_value.field_2._8_8_,local_38);
    }
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_MESSAGE:
    bVar4 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar4) {
      local_2b8 = Reflection::GetRepeatedMessage
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             generator_local._4_4_);
    }
    else {
      local_2b8 = Reflection::GetMessage
                            ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                             (MessageFactory *)0x0);
    }
    Print(this,local_2b8,local_38);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}